

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ListConcatStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  pointer this_01;
  reference other;
  idx_t i;
  ulong __n;
  
  this_00 = input->child_stats;
  vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  for (__n = 1; __n < (ulong)(((long)(this_00->
                                     super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                     ).
                                     super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                    ).
                                    super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x58);
      __n = __n + 1) {
    this_01 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)this);
    other = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,__n);
    BaseStatistics::Merge(this_01,other);
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> ListConcatStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto stats = child_stats[0].ToUnique();
	for (idx_t i = 1; i < child_stats.size(); i++) {
		stats->Merge(child_stats[i]);
	}
	return stats;
}